

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

QHttp2Stream * __thiscall QHttp2Connection::getStream(QHttp2Connection *this,quint32 streamID)

{
  QHttp2Stream *pQVar1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  QWeakPointer<QObject> local_28;
  quint32 local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.value = (QObject *)0x0;
  local_14 = streamID;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
            ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)&local_28,(uint *)(this + 0x1c0),
             (QPointer<QHttp2Stream> *)&local_14);
  if ((local_28.d == (Data *)0x0) ||
     (pQVar1 = (QHttp2Stream *)local_28.value,
     ((local_28.d)->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
    pQVar1 = (QHttp2Stream *)0x0;
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_28);
  QWeakPointer<QObject>::~QWeakPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return pQVar1;
}

Assistant:

QHttp2Stream *QHttp2Connection::getStream(quint32 streamID) const
{
    return m_streams.value(streamID, nullptr).get();
}